

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O3

void print_bittiming(calc_data *data)

{
  calc_ref_clk *pcVar1;
  _Bool _Var2;
  __u32 _Var3;
  can_bittiming_const *pcVar4;
  alg *paVar5;
  can_bittiming *pcVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  uint *puVar17;
  bool bVar18;
  calc_ref_clk *local_78;
  net_device dev;
  can_bittiming local_68;
  double local_48;
  _func_void_can_bittiming_ptr__Bool *local_40;
  ulong local_38;
  
  local_78 = data->ref_clks;
  if (local_78->clk != 0) goto LAB_00104646;
  if (data->quiet == false) {
    printf("Skipping bit timing parameter calculation for %s, no ref clock defined\n\n",
           data->bittiming_const);
    _Var3 = local_78->clk;
    while (_Var3 != 0) {
LAB_00104646:
      local_40 = data->printf_btr;
      puVar17 = data->bitrates;
      if (local_40 == (_func_void_can_bittiming_ptr__Bool *)0x0) {
        local_40 = printf_btr_nop;
      }
      uVar15 = *puVar17;
      if (uVar15 != 0) {
        _Var2 = data->verbose;
        bVar7 = data->quiet;
        do {
          puVar17 = puVar17 + 1;
          uVar16 = 0x36b;
          if (500000 < uVar15) {
            uVar16 = 800;
          }
          if (800000 < uVar15) {
            uVar16 = 0x2ee;
          }
          if (data->sample_point != 0) {
            uVar16 = data->sample_point;
          }
          pcVar4 = data->bittiming_const;
          paVar5 = data->alg;
          pcVar6 = data->opt_bt;
          dev.priv.clock.freq = (can_priv)local_78->clk;
          local_68.tq = 0;
          local_68.prop_seg = 0;
          local_68.phase_seg1 = 0;
          local_68.phase_seg2 = 0;
          local_68.sjw = 0;
          local_68.brp = 0;
          local_68.bitrate = uVar15;
          local_68.sample_point = uVar16;
          if ((bVar7 & 1) == 0) {
            pcVar12 = "";
            if (data->fd_mode != false) {
              pcVar12 = "Data ";
            }
            pcVar13 = local_78->name;
            bVar18 = pcVar13 == (char *)0x0;
            pcVar11 = "(";
            if (bVar18) {
              pcVar11 = "";
              pcVar13 = "";
            }
            pcVar14 = ") ";
            if (bVar18) {
              pcVar14 = "";
            }
            printf("%sBit timing parameters for %s with %.6f MHz ref clock %s%s%susing algo \'%s\'\n"
                   ,SUB84((double)(uint)dev.priv.clock.freq / 1000000.0,0),pcVar12,pcVar4,pcVar11,
                   pcVar13,pcVar14,paVar5->name);
            pcVar12 = " nominal                                  real  Bitrt    nom   real   SampP";
            if (_Var2 != false) {
              local_48 = (double)(ulong)pcVar4->sjw_max;
              local_38 = (ulong)pcVar4->brp_min;
              printf(anon_var_dwarf_762,(ulong)pcVar4->tseg1_min,(ulong)pcVar4->tseg1_max,
                     (ulong)pcVar4->tseg2_min,(ulong)pcVar4->tseg2_max,1,local_48,local_38,
                     (ulong)pcVar4->brp_max,(ulong)pcVar4->brp_inc);
              pcVar12 = 
              " nominal          |    |    |   |   |     real  Bitrt    nom   real   SampP";
            }
            puts(pcVar12);
            printf(" Bitrate TQ[ns] PrS PhS1 PhS2 SJW BRP  Bitrate  Error  SampP  SampP   Error  ");
            (*local_40)(&local_68,true);
            putchar(10);
          }
          if (pcVar6 == (can_bittiming *)0x0) {
            iVar8 = (*(paVar5->field_0).calc_bittiming)(&dev,&local_68,pcVar4);
            if (iVar8 != 0) {
              pcVar12 = "%8d ***bitrate not possible***\n";
              goto LAB_00104844;
            }
LAB_00104853:
            iVar9 = uVar15 - local_68.bitrate;
            iVar8 = -iVar9;
            if (0 < iVar9) {
              iVar8 = iVar9;
            }
            iVar10 = uVar16 - local_68.sample_point;
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            printf("%8d %6d %3d %4d %4d %3d %3d %8d  ",(ulong)uVar15,local_68._8_8_ & 0xffffffff,
                   (ulong)local_68._8_8_ >> 0x20,local_68._16_8_ & 0xffffffff,
                   (ulong)local_68._16_8_ >> 0x20,local_68._24_8_ & 0xffffffff,
                   (ulong)local_68._24_8_ >> 0x20,(ulong)local_68.bitrate);
            if (((double)iVar8 * 100.0) / (double)uVar15 <= 99.9) {
              printf("%4.1f%%  ");
            }
            else {
              printf(anon_var_dwarf_7e6);
            }
            local_48 = (double)uVar16;
            printf("%4.1f%%  %4.1f%%  ",SUB84(local_48 / 10.0,0),
                   SUB84((double)local_68.sample_point / 10.0,0));
            if (((double)iVar9 * 100.0) / local_48 <= 99.9) {
              printf("%4.1f%%   ");
            }
            else {
              printf(anon_var_dwarf_807);
            }
            (*local_40)(&local_68,false);
            putchar(10);
          }
          else {
            local_68.bitrate = pcVar6->bitrate;
            local_68.sample_point = pcVar6->sample_point;
            local_68.tq = pcVar6->tq;
            local_68.prop_seg = pcVar6->prop_seg;
            local_68.phase_seg1 = pcVar6->phase_seg1;
            local_68.phase_seg2 = pcVar6->phase_seg2;
            local_68.sjw = pcVar6->sjw;
            local_68.brp = pcVar6->brp;
            iVar8 = (*(paVar5->field_1).fixup_bittiming)(&dev,&local_68,pcVar4);
            if (iVar8 == 0) goto LAB_00104853;
            pcVar12 = "%8d ***parameters exceed controller\'s range***\n";
LAB_00104844:
            printf(pcVar12,(ulong)uVar15);
          }
          uVar15 = *puVar17;
          bVar7 = 1;
        } while (uVar15 != 0);
      }
      putchar(10);
      pcVar1 = local_78 + 1;
      local_78 = local_78 + 1;
      _Var3 = pcVar1->clk;
    }
  }
  return;
}

Assistant:

static void print_bittiming(const struct calc_data *data)
{
	const struct calc_ref_clk *ref_clks = data->ref_clks;

	if (!ref_clks->clk && !data->quiet)
		printf("Skipping bit timing parameter calculation for %s, no ref clock defined\n\n",
		       data->bittiming_const->name);

	while (ref_clks->clk) {
		void (*printf_btr)(struct can_bittiming *bt, bool hdr);
		unsigned int const *bitrates = data->bitrates;
		bool quiet = data->quiet;
		bool verbose = data->verbose;

		if (data->printf_btr)
			printf_btr = data->printf_btr;
		else
			printf_btr = printf_btr_nop;

		while (*bitrates) {
			unsigned int sample_point;

			/* get nominal sample point */
			if (data->sample_point)
				sample_point = data->sample_point;
			else
				sample_point = get_cia_sample_point(*bitrates);

			print_bittiming_one(data->alg,
					    data->bittiming_const,
					    data->opt_bt,
					    ref_clks,
					    *bitrates,
					    sample_point,
					    printf_btr,
					    quiet,
					    verbose,
					    data->fd_mode);
			bitrates++;
			quiet = true;
		}

		printf("\n");
		ref_clks++;
	}
}